

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::cancel_schedulers(raft_server *this)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> this_00;
  element_type *peVar2;
  __shared_ptr *this_01;
  ptr<delayed_task> *ppVar3;
  int __how;
  int __fd;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> *__y;
  raft_server *in_RDI;
  ptr<peer> *p;
  peer_itor it;
  peer *in_stack_00000058;
  raft_server *in_stack_00000060;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_10 [2];
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->scheduler_);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->election_task_);
    if (bVar1) {
      cancel_task(in_RDI,(ptr<delayed_task> *)in_stack_ffffffffffffffc8);
    }
    std::
    unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
    ::begin(in_stack_ffffffffffffffc8);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_RDI,
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_ffffffffffffffc8);
    while( true ) {
      this_00._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::end(in_stack_ffffffffffffffc8);
      __y = (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> *)
            &stack0xffffffffffffffe0;
      bVar1 = std::__detail::operator!=(local_10,__y);
      __fd = (int)__y;
      if (!bVar1) break;
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x131000);
      peVar2 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x131013);
      this_01 = (__shared_ptr *)peer::get_hb_task(peVar2);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(this_01);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x131033);
        ppVar3 = peer::get_hb_task(peVar2);
        __fd = (int)ppVar3;
        cancel_task(in_RDI,(ptr<delayed_task> *)in_stack_ffffffffffffffc8);
      }
      peVar2 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x131052);
      peer::shutdown(peVar2,__fd,__how);
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_RDI);
      clear_snapshot_sync_ctx(in_stack_00000060,in_stack_00000058);
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)in_RDI);
    }
    std::__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<nuraft::delayed_task_scheduler,_(__gnu_cxx::_Lock_policy)2> *)
               this_00._M_cur);
  }
  return;
}

Assistant:

void raft_server::cancel_schedulers() {
    if (!scheduler_) {
        // Already cancelled.
        return;
    }

    if (election_task_) {
        cancel_task(election_task_);
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        const ptr<peer>& p = it->second;
        if (p->get_hb_task()) {
            cancel_task(p->get_hb_task());
        }
        // Shutdown peer to cut off smart pointers.
        p->shutdown();

        // Free user context of snapshot if exists.
        clear_snapshot_sync_ctx(*p);
    }
    scheduler_.reset();
}